

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

void checksum_final(chksumwork_conflict *sumwrk,chksumval_conflict *sumval)

{
  sumalg sVar1;
  chksumval_conflict *sumval_local;
  chksumwork_conflict *sumwrk_local;
  
  sVar1 = sumwrk->alg;
  if (sVar1 == CKSUM_NONE) {
    sumval->len = 0;
  }
  else if (sVar1 == CKSUM_SHA1) {
    __archive_sha1final(&sumwrk->sha1ctx,sumval->val);
    sumval->len = 0x14;
  }
  else if (sVar1 == CKSUM_MD5) {
    __archive_md5final(&sumwrk->md5ctx,sumval->val);
    sumval->len = 0x10;
  }
  sumval->alg = sumwrk->alg;
  return;
}

Assistant:

static int
checksum_final(struct archive_read *a, const void *a_sum_val,
    size_t a_sum_len, const void *e_sum_val, size_t e_sum_len)
{
	struct xar *xar;
	int r;

	xar = (struct xar *)(a->format->data);
	r = _checksum_final(&(xar->a_sumwrk), a_sum_val, a_sum_len);
	if (r == ARCHIVE_OK)
		r = _checksum_final(&(xar->e_sumwrk), e_sum_val, e_sum_len);
	if (r != ARCHIVE_OK)
		archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
		    "Sumcheck error");
	return (r);
}